

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  int *piVar1;
  ImTextureID *ppvVar2;
  uint *puVar3;
  ImVec2 IVar4;
  ImDrawList *this;
  ImDrawCmd *pIVar5;
  int iVar6;
  ImGuiViewport *pIVar7;
  long lVar8;
  ImDrawCmd *pIVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImDrawCmd cmd;
  ImRect viewport_rect;
  ImDrawCmd local_98;
  ImVec2 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ImVec2 local_30;
  undefined1 local_28 [16];
  
  if (0xffffff < col) {
    pIVar7 = GetMainViewport();
    IVar4 = pIVar7->Pos;
    fVar10 = (pIVar7->Size).x + IVar4.x;
    fVar11 = (pIVar7->Size).y + IVar4.y;
    local_28._8_4_ = fVar10;
    local_28._0_4_ = IVar4.x;
    local_28._4_4_ = IVar4.y;
    local_28._12_4_ = fVar11;
    this = window->RootWindow->DrawList;
    fVar12 = IVar4.x;
    fVar13 = IVar4.y;
    if ((this->CmdBuffer).Size == 0) {
      local_48 = CONCAT44(fVar11,fVar10);
      uStack_40 = 0;
      uStack_50 = 0;
      local_58 = IVar4;
      ImDrawList::AddDrawCmd(this);
      fVar10 = (float)local_48;
      fVar11 = local_48._4_4_;
      fVar12 = local_58.x;
      fVar13 = local_58.y;
    }
    local_98.ClipRect.y = fVar13 + -1.0;
    local_98.ClipRect.x = fVar12 + -1.0;
    local_30.y = fVar11 + 1.0;
    local_30.x = fVar10 + 1.0;
    ImDrawList::PushClipRect(this,(ImVec2 *)&local_98,&local_30,false);
    ImDrawList::AddRectFilled(this,(ImVec2 *)local_28,(ImVec2 *)(local_28 + 8),col,0.0,0);
    iVar6 = (this->CmdBuffer).Size;
    lVar8 = (long)iVar6;
    if (lVar8 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                    ,0x70c,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar9 = (this->CmdBuffer).Data;
    pIVar5 = pIVar9 + lVar8 + -1;
    local_98.ClipRect.x = (pIVar5->ClipRect).x;
    local_98.ClipRect.y = (pIVar5->ClipRect).y;
    local_98.ClipRect.z = (pIVar5->ClipRect).z;
    local_98.ClipRect.w = (pIVar5->ClipRect).w;
    ppvVar2 = &pIVar9[lVar8 + -1].TextureId;
    local_98.TextureId._0_4_ = *(undefined4 *)ppvVar2;
    local_98.TextureId._4_4_ = *(undefined4 *)((long)ppvVar2 + 4);
    local_98.VtxOffset = *(uint *)(ppvVar2 + 1);
    local_98.IdxOffset = *(uint *)((long)ppvVar2 + 0xc);
    puVar3 = &pIVar9[lVar8 + -1].ElemCount;
    local_98.ElemCount = *puVar3;
    local_98._36_4_ = puVar3[1];
    local_98.UserCallback._0_4_ = puVar3[2];
    local_98.UserCallback._4_4_ = puVar3[3];
    local_98.UserCallbackData = pIVar9[lVar8 + -1].UserCallbackData;
    if (local_98.ElemCount != 6) {
      __assert_fail("cmd.ElemCount == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x129f,"void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *, ImU32)");
    }
    iVar6 = iVar6 + -1;
    (this->CmdBuffer).Size = iVar6;
    if (iVar6 == 0) {
      if ((this->CmdBuffer).Capacity == 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar9 = (ImDrawCmd *)(*GImAllocatorAllocFunc)(0x1c0,GImAllocatorUserData);
        pIVar5 = (this->CmdBuffer).Data;
        if (pIVar5 != (ImDrawCmd *)0x0) {
          memcpy(pIVar9,pIVar5,(long)(this->CmdBuffer).Size * 0x38);
          pIVar5 = (this->CmdBuffer).Data;
          if ((pIVar5 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
        }
        (this->CmdBuffer).Data = pIVar9;
        (this->CmdBuffer).Capacity = 8;
        lVar8 = (long)(this->CmdBuffer).Size;
      }
      else {
        lVar8 = 0;
      }
      pIVar9[lVar8].UserCallbackData = local_98.UserCallbackData;
      *(ulong *)&pIVar9[lVar8].ElemCount = CONCAT44(local_98._36_4_,local_98.ElemCount);
      *(ImDrawCallback *)(&pIVar9[lVar8].ElemCount + 2) =
           (ImDrawCallback)CONCAT44(local_98.UserCallback._4_4_,local_98.UserCallback._0_4_);
      pIVar9[lVar8].TextureId =
           (ImTextureID)CONCAT44(local_98.TextureId._4_4_,local_98.TextureId._0_4_);
      (&pIVar9[lVar8].TextureId)[1] = (ImTextureID)CONCAT44(local_98.IdxOffset,local_98.VtxOffset);
      pIVar9 = pIVar9 + lVar8;
      (pIVar9->ClipRect).x = local_98.ClipRect.x;
      (pIVar9->ClipRect).y = local_98.ClipRect.y;
      (pIVar9->ClipRect).z = local_98.ClipRect.z;
      (pIVar9->ClipRect).w = local_98.ClipRect.w;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    }
    else {
      ImVector<ImDrawCmd>::insert(&this->CmdBuffer,pIVar9,&local_98);
    }
    ImDrawList::PopClipRect(this);
    ImDrawList::AddDrawCmd(this);
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = (ImGuiViewportP*)GetMainViewport();
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindow->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }
}